

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O0

void anon_unknown.dwarf_13b32::testShiftPixels(void)

{
  ostream *poVar1;
  int DY;
  int DX;
  Rand48 random_1;
  Rand48 random;
  DeepImage img2;
  DeepImage img1;
  unsigned_long in_stack_fffffffffffffda8;
  Vec2<int> *in_stack_fffffffffffffdb0;
  Vec2<int> *in_stack_fffffffffffffdb8;
  Box<Imath_3_2::Vec2<int>_> *in_stack_fffffffffffffdc0;
  allocator<char> *in_stack_fffffffffffffde0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffde8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Box *pBVar2;
  DeepImage *img2_00;
  int iVar3;
  int iVar4;
  allocator<char> local_1b9;
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [32];
  Vec2<int> local_170;
  undefined1 local_168 [24];
  DeepImage local_150 [111];
  allocator<char> local_e1;
  string local_e0 [55];
  DeepImage local_a9;
  string local_a8 [32];
  Vec2<int> local_88;
  Vec2<int> local_80;
  Box local_78 [16];
  DeepImage local_68 [104];
  
  poVar1 = std::operator<<((ostream *)&std::cout,"pixel shifting");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Vec2<int>::Vec2(&local_80,0xf,0x14);
  Imath_3_2::Vec2<int>::Vec2(&local_88,0x2d,0x3c);
  pBVar2 = local_78;
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  Imf_3_4::DeepImage::DeepImage(local_68,pBVar2,MIPMAP_LEVELS,ROUND_DOWN);
  img2_00 = &local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  Imf_3_4::Image::insertChannel((string *)local_68,(PixelType)local_a8,1,1,true);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
  Imf_3_4::Image::insertChannel((string *)local_68,(PixelType)local_e0,1,1,true);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168;
  Imath_3_2::Vec2<int>::Vec2((Vec2<int> *)this,0xf,0x14);
  Imath_3_2::Vec2<int>::Vec2(&local_170,0x2d,0x3c);
  Imath_3_2::Box<Imath_3_2::Vec2<int>_>::Box
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  Imf_3_4::DeepImage::DeepImage(local_150,(Box *)(local_168 + 8),MIPMAP_LEVELS,ROUND_DOWN);
  __s = &local_191;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,in_stack_fffffffffffffde0);
  Imf_3_4::Image::insertChannel((string *)local_150,(PixelType)local_190,1,1,true);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  __a = &local_1b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this,(char *)__s,__a);
  Imf_3_4::Image::insertChannel((string *)local_150,(PixelType)local_1b8,1,1,true);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  poVar1 = std::operator<<((ostream *)&std::cout,"    generating random pixel values");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Rand48::Rand48((Rand48 *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fillChannels((Rand48 *)__a,(DeepImage *)poVar1);
  Imath_3_2::Rand48::Rand48((Rand48 *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  fillChannels((Rand48 *)__a,(DeepImage *)poVar1);
  iVar4 = 5;
  iVar3 = 7;
  poVar1 = std::operator<<((ostream *)&std::cout,"    shifting, dx = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar4);
  poVar1 = std::operator<<(poVar1,", dy = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar3);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  Imf_3_4::Image::shiftPixels((int)local_150,iVar4);
  poVar1 = std::operator<<((ostream *)&std::cout,"    comparing");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  verifyImagesAreEqual
            ((DeepImage *)CONCAT44(iVar4,iVar3),img2_00,(int)((ulong)pBVar2 >> 0x20),(int)pBVar2);
  Imf_3_4::DeepImage::~DeepImage(local_150);
  Imf_3_4::DeepImage::~DeepImage(local_68);
  return;
}

Assistant:

void
testShiftPixels ()
{
    cout << "pixel shifting" << endl;

    FlatImage img1 (Box2i (V2i (15, 20), V2i (45, 60)), MIPMAP_LEVELS);
    img1.insertChannel ("A", HALF);
    img1.insertChannel ("B", HALF);

    FlatImage img2 (Box2i (V2i (15, 20), V2i (45, 60)), MIPMAP_LEVELS);
    img2.insertChannel ("A", HALF);
    img2.insertChannel ("B", HALF);

    cout << "    generating random pixel values" << endl;

    {
        Rand48 random (1);
        fillChannels (random, img1);
    }

    {
        Rand48 random (1);
        fillChannels (random, img2);
    }

    int DX = 5;
    int DY = 7;

    cout << "    shifting, dx = " << DX << ", dy = " << DY << endl;
    img2.shiftPixels (DX, DY);

    cout << "    comparing" << endl;
    verifyImagesAreEqual (img1, img2, DX, DY);
}